

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::switchToFullscreen(WindowImplX11 *this)

{
  Display *pDVar1;
  bool bVar2;
  int iVar3;
  Atom AVar4;
  Atom AVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  XEvent event;
  
  grabFocus(this);
  bVar2 = anon_unknown.dwarf_306bcd::WindowsImplX11Impl::ewmhSupported();
  if (bVar2) {
    lVar7 = (long)&event + 0x10;
    event.pad[0] = lVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&event,"_NET_WM_BYPASS_COMPOSITOR","")
    ;
    AVar4 = getAtom((string *)&event.xany,false);
    if (event.pad[0] != lVar7) {
      operator_delete((void *)event.pad[0]);
    }
    if (AVar4 != 0) {
      XChangeProperty(this->m_display,this->m_window,AVar4,6,0x20,0,
                      &switchToFullscreen::bypassCompositor,1);
    }
    event.pad[0] = lVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&event,"_NET_WM_STATE","");
    AVar4 = getAtom((string *)&event.xany,true);
    if (event.pad[0] != lVar7) {
      operator_delete((void *)event.pad[0]);
    }
    event.pad[0] = lVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&event,"_NET_WM_STATE_FULLSCREEN","");
    AVar5 = getAtom((string *)&event.xany,true);
    if (event.pad[0] != lVar7) {
      operator_delete((void *)event.pad[0]);
    }
    if (AVar4 == 0 || AVar5 == 0) {
      poVar6 = err();
      pcVar8 = "Setting fullscreen failed. Could not get required atoms";
      lVar7 = 0x37;
    }
    else {
      memset(&event,0,0xc0);
      event.type = 0x21;
      event.xany.window = this->m_window;
      event.xexpose.width = 0x20;
      event.xkey.time = 1;
      event.xconfigure.above = 0;
      event.pad[10] = 1;
      pDVar1 = this->m_display;
      event.xproperty.atom = AVar4;
      event.xselectionrequest.property = AVar5;
      iVar3 = XSendEvent(pDVar1,*(undefined8 *)
                                 (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                 (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0x180000,&event);
      if (iVar3 != 0) {
        return;
      }
      poVar6 = err();
      pcVar8 = "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event";
      lVar7 = 0x3f;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  return;
}

Assistant:

void WindowImplX11::switchToFullscreen()
{
    using namespace WindowsImplX11Impl;

    grabFocus();

    if (ewmhSupported())
    {
        Atom netWmBypassCompositor = getAtom("_NET_WM_BYPASS_COMPOSITOR");

        if (netWmBypassCompositor)
        {
            static const unsigned long bypassCompositor = 1;

            XChangeProperty(m_display,
                            m_window,
                            netWmBypassCompositor,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&bypassCompositor),
                            1);
        }

        Atom netWmState = getAtom("_NET_WM_STATE", true);
        Atom netWmStateFullscreen = getAtom("_NET_WM_STATE_FULLSCREEN", true);

        if (!netWmState || !netWmStateFullscreen)
        {
            err() << "Setting fullscreen failed. Could not get required atoms" << std::endl;
            return;
        }

        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netWmState;
        event.xclient.data.l[0] = 1; // _NET_WM_STATE_ADD
        event.xclient.data.l[1] = static_cast<long>(netWmStateFullscreen);
        event.xclient.data.l[2] = 0; // No second property
        event.xclient.data.l[3] = 1; // Normal window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event" << std::endl;
    }
}